

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.cpp
# Opt level: O3

ostream * OpenMD::operator<<(ostream *os,OpenMDBitSet *bs)

{
  int iVar1;
  long lVar2;
  ostream *poVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  bool bVar8;
  string val;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  lVar2 = (long)(bs->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  if (((long)(bs->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - lVar2) * 8 +
      (ulong)(bs->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset != 0) {
    lVar7 = 0;
    uVar5 = 0;
    do {
      iVar1 = (int)uVar5;
      iVar4 = iVar1 + 0x3f;
      if (-1 < iVar1) {
        iVar4 = iVar1;
      }
      bVar8 = (*(ulong *)(lVar2 + (long)(iVar4 >> 6) * 8 + -8 +
                         (ulong)((lVar7 >> 0x20 & 0x800000000000003fU) < 0x8000000000000001) * 8) >>
               (uVar5 & 0x3f) & 1) != 0;
      pcVar6 = "true";
      if (!bVar8) {
        pcVar6 = "false";
      }
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,pcVar6,pcVar6 + (5 - (ulong)bVar8));
      std::__ostream_insert<char,std::char_traits<char>>(os,"OpenMDBitSet[",0xd);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)os);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] = ",4);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_50,local_48);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      uVar5 = uVar5 + 1;
      lVar2 = (long)(bs->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      lVar7 = lVar7 + 0x100000000;
    } while (uVar5 < (ulong)(bs->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                     ((long)(bs->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - lVar2
                     ) * 8);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const OpenMDBitSet& bs) {
    for (size_t i = 0; i < bs.bitset_.size(); ++i) {
      std::string val = bs[i] ? "true" : "false";
      os << "OpenMDBitSet[" << i << "] = " << val << std::endl;
    }

    return os;
  }